

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPrivateKey.cpp
# Opt level: O2

bool __thiscall DSAPrivateKey::deserialise(DSAPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dX;
  ByteString dG;
  ByteString dQ;
  ByteString dP;
  ByteString BStack_b8;
  ByteString local_90;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  ByteString::chainDeserialise(&local_90,serialised);
  ByteString::chainDeserialise(&BStack_b8,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&local_90);
      if (sVar1 != 0) {
        sVar1 = ByteString::size(&BStack_b8);
        if (sVar1 != 0) {
          (**(code **)(*(long *)this + 0x48))(this,&local_40);
          (**(code **)(*(long *)this + 0x50))(this,&local_68);
          (**(code **)(*(long *)this + 0x58))(this,&local_90);
          bVar2 = true;
          (**(code **)(*(long *)this + 0x40))(this,&BStack_b8);
          goto LAB_0012bf67;
        }
      }
    }
  }
  bVar2 = false;
LAB_0012bf67:
  ByteString::~ByteString(&BStack_b8);
  ByteString::~ByteString(&local_90);
  ByteString::~ByteString(&local_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool DSAPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dX = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dQ.size() == 0) ||
	    (dG.size() == 0) ||
	    (dX.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setG(dG);
	setX(dX);

	return true;
}